

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_error.cc
# Opt level: O2

void QL_PrintError(RC rc)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  
  if (rc - 0x191U < 9) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"QL warning: ");
    pcVar3 = _ZL10QL_WarnMsg_rel + *(int *)(_ZL10QL_WarnMsg_rel + (ulong)(rc - 0x191U) * 4);
  }
  else {
    if (rc == 0) {
      poVar1 = (ostream *)&std::cerr;
      pcVar3 = "QL_PrintError called with return code of 0\n";
      goto LAB_00117a3d;
    }
    if (rc == -0xb) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      poVar1 = (ostream *)&std::cerr;
    }
    else {
      if (rc != -0x191) {
        poVar1 = std::operator<<((ostream *)&std::cerr,"QL error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,rc);
        pcVar3 = " is out of bounds\n";
        goto LAB_00117a3d;
      }
      poVar1 = std::operator<<((ostream *)&std::cerr,"QL error: ");
      pcVar3 = "Invalid database";
    }
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  pcVar3 = "\n";
LAB_00117a3d:
  std::operator<<(poVar1,pcVar3);
  return;
}

Assistant:

void QL_PrintError(RC rc)
{
  // Check the return code is within proper limits
  if (rc >= START_QL_WARN && rc <= QL_LASTWARN)
    // Print warning
    cerr << "QL warning: " << QL_WarnMsg[rc - START_QL_WARN] << "\n";
  // Error codes are negative, so invert everything
  else if (-rc >= -START_QL_ERR && -rc < -QL_LASTERROR)
    // Print error
    cerr << "QL error: " << QL_ErrorMsg[-rc + START_QL_ERR] << "\n";
  else if (rc == PF_UNIX)
#ifdef PC
      cerr << "OS error\n";
#else
      cerr << strerror(errno) << "\n";
#endif
  else if (rc == 0)
    cerr << "QL_PrintError called with return code of 0\n";
  else
    cerr << "QL error: " << rc << " is out of bounds\n";
}